

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O1

void rcg::convYCbCr411toRGB(uint8_t *rgb,uint8_t *row,int i)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint8_t uVar5;
  int iVar6;
  
  iVar4 = i >> 2;
  bVar1 = row[iVar4 * 6 + 2];
  bVar2 = row[iVar4 * 6 + 5];
  uVar3 = row[(iVar4 * 6 + (i & 3U) + 1) - (uint)((i & 3U) < 2)] | 0xffffff00;
  iVar4 = ((uint)bVar2 * 0x5a + 0x1320 >> 6) + uVar3;
  iVar6 = 0;
  if (iVar4 < 1) {
    iVar4 = iVar6;
  }
  uVar5 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar5 = 0xff;
  }
  *rgb = uVar5;
  iVar4 = ((uint)bVar2 * -0x2e + (uint)bVar1 * -0x16 + 0x6220 >> 6) + uVar3;
  if (iVar4 < 1) {
    iVar4 = iVar6;
  }
  uVar5 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar5 = 0xff;
  }
  rgb[1] = uVar5;
  iVar4 = uVar3 + ((uint)bVar1 * 0x71 + 0x7a0 >> 6);
  if (iVar4 < 1) {
    iVar4 = iVar6;
  }
  uVar5 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar5 = 0xff;
  }
  rgb[2] = uVar5;
  return;
}

Assistant:

void convYCbCr411toRGB(uint8_t rgb[3], const uint8_t *row, int i)
{
  const uint32_t j=static_cast<uint32_t>((i>>2)*6);
  const uint32_t js=static_cast<uint32_t>(i&0x3);

  int Y=row[j+js];
  if (js > 1)
  {
    Y=row[j+js+1];
  }

  const int Cb=static_cast<int>(row[j+2])-128;
  const int Cr=static_cast<int>(row[j+5])-128;

  // conversion of YCbCr into RGB with correct rounding
  const int rc=((90*Cr+16384+32)>>6)-256;
  const int gc=((-22*Cb-46*Cr+16384+32)>>6)-256;
  const int bc=((113*Cb+16384+32)>>6)-256;

  rgb[0]=clamp8(Y+rc);
  rgb[1]=clamp8(Y+gc);
  rgb[2]=clamp8(Y+bc);
}